

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::AcesInputFile::AcesInputFile(AcesInputFile *this,string *name,int numThreads)

{
  float (*pafVar1) [4];
  Data *pDVar2;
  RgbaInputFile *this_00;
  
  this->_vptr_AcesInputFile = (_func_int **)&PTR__AcesInputFile_001e2c10;
  pDVar2 = (Data *)operator_new(0x70);
  pDVar2->rgbaFile = (RgbaInputFile *)0x0;
  pDVar2->fbBase = (Rgba *)0x0;
  pDVar2->fbXStride = 0;
  pDVar2->fbYStride = 0;
  *(undefined8 *)((long)&pDVar2->fbYStride + 1) = 0;
  *(undefined8 *)((long)&pDVar2->minX + 1) = 0;
  (pDVar2->fileToAces).x[0][0] = 1.0;
  *(float *)((long)((pDVar2->fileToAces).x + 0) + 4) = 0.0;
  *(float *)((long)((pDVar2->fileToAces).x + 0) + 8) = 0.0;
  *(undefined8 *)((pDVar2->fileToAces).x[0] + 3) = 0;
  (pDVar2->fileToAces).x[1][1] = 1.0;
  pafVar1 = (pDVar2->fileToAces).x;
  *(float *)((long)(pafVar1 + 1) + 8) = 0.0;
  *(float *)((long)(pafVar1 + 1) + 0xc) = 0.0;
  *(float *)((long)((pDVar2->fileToAces).x + 2) + 0) = 0.0;
  *(float *)((long)((pDVar2->fileToAces).x + 2) + 4) = 0.0;
  (pDVar2->fileToAces).x[2][2] = 1.0;
  *(undefined8 *)((pDVar2->fileToAces).x[2] + 3) = 0;
  pafVar1 = (pDVar2->fileToAces).x;
  *(float *)((long)(pafVar1 + 3) + 4) = 0.0;
  *(float *)((long)(pafVar1 + 3) + 8) = 0.0;
  (pDVar2->fileToAces).x[3][3] = 1.0;
  this->_data = pDVar2;
  this_00 = (RgbaInputFile *)operator_new(0x40);
  RgbaInputFile::RgbaInputFile(this_00,(name->_M_dataplus)._M_p,numThreads);
  pDVar2 = this->_data;
  pDVar2->rgbaFile = this_00;
  Data::initColorConversion(pDVar2);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (const std::string& name, int numThreads)
    : _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (name.c_str (), numThreads);
    _data->initColorConversion ();
}